

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O2

void __thiscall
amrex::MLMG::prepareForSolve
          (MLMG *this,Vector<amrex::Any,_std::allocator<amrex::Any>_> *a_sol,
          Vector<amrex::Any,_std::allocator<amrex::Any>_> *a_rhs)

{
  Vector<amrex::Any,_std::allocator<amrex::Any>_> *this_00;
  uint uVar1;
  _func_int **pp_Var2;
  pointer pAVar3;
  __uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_> _Var4;
  long *plVar5;
  pointer pAVar6;
  long *plVar7;
  _Head_base<0UL,_amrex::Any::innards_base_*,_false> *this_01;
  long *plVar8;
  Vector<amrex::Any,_std::allocator<amrex::Any>_> *pVVar9;
  undefined8 uVar10;
  bool bVar11;
  int iVar12;
  int extraout_var;
  MLLinOp *pMVar13;
  long lVar14;
  ostream *poVar15;
  Print *pPVar16;
  int extraout_EDX;
  int alev_1;
  int alev_4;
  int iVar17;
  ulong uVar18;
  int alev;
  ulong uVar19;
  long lVar20;
  ostringstream *this_02;
  int alev_2;
  long lVar21;
  ulong uVar22;
  long *local_200;
  innards_base *local_1f8;
  uint local_1f0;
  IntVect ng_sol;
  undefined8 local_1dc;
  uint local_1d4;
  int *local_1d0;
  Vector<amrex::Any,_std::allocator<amrex::Any>_> *local_1c8;
  Vector<amrex::Any,_std::allocator<amrex::Any>_> *local_1c0;
  undefined1 local_1b8 [392];
  
  local_1b8._0_8_ = (innards_base *)0x0;
  local_1c0 = a_rhs;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&(this->timer).super_vector<double,_std::allocator<double>_>,3,
             (value_type_conflict2 *)local_1b8);
  local_1dc = (innards_base *)0x0;
  local_1d4 = 0;
  ng_sol.vect[0] = 1;
  ng_sol.vect[1] = 1;
  ng_sol.vect[2] = 1;
  pMVar13 = this->linop;
  uVar19 = (ulong)(uint)(pMVar13->info).hidden_direction;
  if (uVar19 < 3) {
    ng_sol.vect[uVar19] = 0;
  }
  pp_Var2 = pMVar13->_vptr_MLLinOp;
  if (this->linop_prepared == false) {
    (*pp_Var2[0x1d])();
    this->linop_prepared = true;
  }
  else {
    iVar12 = (*pp_Var2[7])();
    if ((char)iVar12 != '\0') {
      (*this->linop->_vptr_MLLinOp[8])();
    }
  }
  local_1c8 = &this->sol;
  local_1d0 = &this->namrlevs;
  std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
            (&local_1c8->super_vector<amrex::Any,_std::allocator<amrex::Any>_>,(long)this->namrlevs)
  ;
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->sol_is_alias).super_vector<int,_std::allocator<int>_>,(long)this->namrlevs);
  for (uVar19 = 0; (long)uVar19 < (long)*local_1d0; uVar19 = uVar19 + 1) {
    if (this->cf_strategy == ghostnodes) {
      (*this->linop->_vptr_MLLinOp[0x2a])
                ((_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)local_1b8,this->linop,
                 (a_sol->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar19);
      uVar10 = local_1b8._0_8_;
      pAVar3 = (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_1b8._0_8_ = (innards_base *)0x0;
      _Var4._M_t.
      super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
      .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl =
           *(tuple<amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_> *)
            &pAVar3[uVar19].m_ptr._M_t;
      pAVar3[uVar19].m_ptr._M_t =
           (__uniq_ptr_data<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>,_true,_true>
            )uVar10;
      if ((__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
          )_Var4._M_t.
           super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
           .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
          )0x0) {
        (**(code **)(*(long *)_Var4._M_t.
                              super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                              .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl
                    + 0x10))();
      }
      if ((innards_base *)local_1b8._0_8_ != (innards_base *)0x0) {
        (*(*(_func_int ***)local_1b8._0_8_)[2])();
      }
LAB_005d66c7:
      iVar12 = 1;
    }
    else {
      iVar12 = (*this->linop->_vptr_MLLinOp[0x2b])
                         (this->linop,
                          (a_sol->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                          super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar19);
      if (((ng_sol.vect[0] == iVar12) && (ng_sol.vect[1] == extraout_var)) &&
         (extraout_EDX == ng_sol.vect[2])) {
        (*this->linop->_vptr_MLLinOp[0x2a])
                  ((_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)local_1b8,this->linop,
                   (a_sol->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                   super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar19);
        uVar10 = local_1b8._0_8_;
        pAVar3 = (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_1b8._0_8_ = (innards_base *)0x0;
        _Var4._M_t.
        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl =
             *(tuple<amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_> *)
              &pAVar3[uVar19].m_ptr._M_t;
        pAVar3[uVar19].m_ptr._M_t =
             (__uniq_ptr_data<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>,_true,_true>
              )uVar10;
        if ((__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
             )_Var4._M_t.
              super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
              .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
             )0x0) {
          (**(code **)(*(long *)_Var4._M_t.
                                super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                _M_head_impl + 0x10))();
        }
        if ((innards_base *)local_1b8._0_8_ != (innards_base *)0x0) {
          (*(*(_func_int ***)local_1b8._0_8_)[2])();
        }
        (*this->linop->_vptr_MLLinOp[0x2f])
                  (this->linop,
                   (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                   super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar19);
        goto LAB_005d66c7;
      }
      if (this->solve_called == 0) {
        (*this->linop->_vptr_MLLinOp[0x27])
                  ((_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)local_1b8,this->linop,
                   uVar19 & 0xffffffff,0,&ng_sol);
        uVar10 = local_1b8._0_8_;
        pAVar3 = (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_1b8._0_8_ = (innards_base *)0x0;
        _Var4._M_t.
        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl =
             *(tuple<amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_> *)
              &pAVar3[uVar19].m_ptr._M_t;
        pAVar3[uVar19].m_ptr._M_t =
             (__uniq_ptr_data<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>,_true,_true>
              )uVar10;
        if ((__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
             )_Var4._M_t.
              super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
              .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
             )0x0) {
          (**(code **)(*(long *)_Var4._M_t.
                                super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                _M_head_impl + 0x10))();
        }
        if ((innards_base *)local_1b8._0_8_ != (innards_base *)0x0) {
          (*(*(_func_int ***)local_1b8._0_8_)[2])();
        }
      }
      local_1b8._0_8_ = (innards_base *)0x0;
      local_1b8._8_4_ = 0;
      (*this->linop->_vptr_MLLinOp[0x2c])
                (this->linop,
                 (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar19,
                 (a_sol->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar19,
                 (_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)local_1b8);
      (*this->linop->_vptr_MLLinOp[0x2f])
                (this->linop,
                 (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar19);
      iVar12 = 0;
    }
    (this->sol_is_alias).super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[uVar19] =
         iVar12;
  }
  this_00 = &this->rhs;
  std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
            (&this_00->super_vector<amrex::Any,_std::allocator<amrex::Any>_>,(long)*local_1d0);
  lVar20 = 0;
  lVar21 = 0;
  for (uVar19 = 0; pVVar9 = local_1c8, (long)uVar19 < (long)*local_1d0; uVar19 = uVar19 + 1) {
    pMVar13 = this->linop;
    if (this->cf_strategy == ghostnodes) {
      local_1d4 = (*pMVar13->_vptr_MLLinOp[6])(pMVar13,uVar19 & 0xffffffff,0);
      local_1dc = (innards_base *)CONCAT44(local_1d4,local_1d4);
      pMVar13 = this->linop;
    }
    if (this->solve_called == 0) {
      (*pMVar13->_vptr_MLLinOp[0x27])
                ((_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)local_1b8,pMVar13,
                 uVar19 & 0xffffffff,0,&local_1dc);
      uVar10 = local_1b8._0_8_;
      pAVar3 = (this_00->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_1b8._0_8_ = (innards_base *)0x0;
      plVar5 = *(long **)((long)&(pAVar3->m_ptr)._M_t.
                                 super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                 .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                 _M_head_impl + lVar20);
      *(undefined8 *)
       ((long)&(pAVar3->m_ptr)._M_t.
               super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
               .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl + lVar20) =
           uVar10;
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 0x10))();
      }
      if ((innards_base *)local_1b8._0_8_ != (innards_base *)0x0) {
        (*(*(_func_int ***)local_1b8._0_8_)[2])();
      }
      pMVar13 = this->linop;
    }
    (*pMVar13->_vptr_MLLinOp[0x2c])
              (pMVar13,(long)&(((this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                                super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                                super__Vector_impl_data._M_start)->m_ptr)._M_t.
                              super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                              .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl
                       + lVar20,
               (long)&(((local_1c0->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                        super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                        super__Vector_impl_data._M_start)->m_ptr)._M_t.
                      super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                      .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
               lVar20,&local_1dc);
    (*this->linop->_vptr_MLLinOp[0x15])(this->linop,uVar19 & 0xffffffff,0);
    (*this->linop->_vptr_MLLinOp[0x17])
              (this->linop,uVar19 & 0xffffffff,
               (long)&(((this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                        super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                        super__Vector_impl_data._M_start)->m_ptr)._M_t.
                      super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                      .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
               lVar20);
    (*this->linop->_vptr_MLLinOp[0x18])
              (this->linop,uVar19 & 0xffffffff,
               (long)&(((this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                        super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                        super__Vector_impl_data._M_start)->m_ptr)._M_t.
                      super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                      .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
               lVar20);
    (*this->linop->_vptr_MLLinOp[0x19])
              (this->linop,uVar19 & 0xffffffff,
               (long)&(((this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                        super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                        super__Vector_impl_data._M_start)->m_ptr)._M_t.
                      super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                      .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
               lVar20);
    (*this->linop->_vptr_MLLinOp[0x1a])
              (this->linop,uVar19 & 0xffffffff,
               (long)&(((this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                        super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                        super__Vector_impl_data._M_start)->m_ptr)._M_t.
                      super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                      .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
               lVar20);
    pMVar13 = this->linop;
    lVar14 = **(long **)((long)&(((pMVar13->m_factory).
                                  super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                                ).
                                super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar21);
    if (lVar14 != 0) {
      lVar14 = __dynamic_cast(lVar14,&FabFactory<amrex::FArrayBox>::typeinfo,
                              &EBFArrayBoxFactory::typeinfo);
      if (lVar14 != 0) {
        (*pMVar13->_vptr_MLLinOp[0x30])
                  (pMVar13,(long)&(((this->rhs).
                                    super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                                    super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->m_ptr)._M_t.
                                  super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                  .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                  _M_head_impl + lVar20);
        (*this->linop->_vptr_MLLinOp[0x30])();
      }
    }
    lVar21 = lVar21 + 0x18;
    lVar20 = lVar20 + 8;
  }
  uVar19 = (ulong)(uint)this->finest_amr_lev;
  lVar20 = uVar19 * 8;
  while (pMVar13 = this->linop, 0 < (int)uVar19) {
    uVar19 = uVar19 - 1;
    pAVar3 = (pVVar9->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
             super__Vector_impl_data._M_start;
    pAVar6 = (this_00->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
             super__Vector_impl_data._M_start;
    (*pMVar13->_vptr_MLLinOp[0x3e])
              (pMVar13,uVar19 & 0xffffffff,pAVar3 + (uVar19 & 0xffffffff),
               pAVar6 + (uVar19 & 0xffffffff),
               (long)&(pAVar3->m_ptr)._M_t.
                      super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                      .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
               lVar20,(long)&(pAVar6->m_ptr)._M_t.
                             super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                             .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl
                      + lVar20);
    lVar20 = lVar20 + -8;
  }
  iVar12 = (*pMVar13->_vptr_MLLinOp[0x1e])(pMVar13,0);
  pMVar13 = this->linop;
  if (((char)iVar12 != '\0') && (pMVar13->enforceSingularSolvable == true)) {
    makeSolvable(this);
    pMVar13 = this->linop;
  }
  bVar11 = MLLinOp::isCellCentered(pMVar13);
  bVar11 = !bVar11;
  local_1f8 = (innards_base *)(ulong)CONCAT14(bVar11,(uint)bVar11);
  local_1f0 = (uint)bVar11;
  if (this->cf_strategy == ghostnodes) {
    local_1f0 = local_1d4;
    local_1f8 = local_1dc;
  }
  if (this->solve_called == 0) {
    MLLinOp::make(this->linop,&this->res,(IntVect *)&local_1f8);
    MLLinOp::make(this->linop,&this->rescor,(IntVect *)&local_1f8);
  }
  for (lVar20 = 0; lVar20 <= this->finest_amr_lev; lVar20 = lVar20 + 1) {
    uVar1 = (this->linop->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [lVar20];
    uVar19 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar19 = 0;
    }
    for (lVar21 = 0; uVar19 * 8 != lVar21; lVar21 = lVar21 + 8) {
      (*this->linop->_vptr_MLLinOp[0x2e])
                (this->linop,
                 *(long *)&(this->res).
                           super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar20].
                           super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar21);
      (*this->linop->_vptr_MLLinOp[0x2e])
                (this->linop,
                 *(long *)&(this->rescor).
                           super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar20].
                           super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar21);
    }
  }
  if (this->cf_strategy != ghostnodes) {
    local_1f0 = ng_sol.vect[2];
    local_1f8 = (innards_base *)ng_sol.vect._0_8_;
  }
  std::
  vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::resize(&(this->cor).
            super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
           ,(long)this->namrlevs);
  for (uVar19 = 0; (long)uVar19 <= (long)this->finest_amr_lev; uVar19 = uVar19 + 1) {
    uVar1 = (this->linop->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [uVar19];
    std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
              (&(this->cor).
                super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                .
                super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar19].
                super_vector<amrex::Any,_std::allocator<amrex::Any>_>,(long)(int)uVar1);
    uVar22 = 0;
    if (0 < (int)uVar1) {
      uVar22 = (ulong)uVar1;
    }
    uVar18 = 0;
    for (lVar20 = 0; uVar22 * 8 != lVar20; lVar20 = lVar20 + 8) {
      if (this->solve_called == 0) {
        local_1b8._8_4_ = local_1f0;
        local_1b8._0_8_ = local_1f8;
        if (this->cf_strategy == ghostnodes) {
          local_1b8._8_4_ =
               (*this->linop->_vptr_MLLinOp[6])(this->linop,uVar19 & 0xffffffff,uVar18 & 0xffffffff)
          ;
          local_1b8._4_4_ = local_1b8._8_4_;
          local_1b8._0_4_ = local_1b8._8_4_;
        }
        (*this->linop->_vptr_MLLinOp[0x27])
                  (&local_200,this->linop,uVar19 & 0xffffffff,uVar18 & 0xffffffff,
                   (_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)local_1b8);
        plVar7 = local_200;
        lVar21 = *(long *)&(this->cor).
                           super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar19].
                           super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>;
        local_200 = (long *)0x0;
        plVar5 = *(long **)(lVar21 + lVar20);
        *(long **)(lVar21 + lVar20) = plVar7;
        if (plVar5 != (long *)0x0) {
          (**(code **)(*plVar5 + 0x10))();
        }
        if (local_200 != (long *)0x0) {
          (**(code **)(*local_200 + 0x10))();
        }
      }
      (*this->linop->_vptr_MLLinOp[0x2e])
                (this->linop,
                 *(long *)&(this->cor).
                           super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar19].
                           super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar20);
      uVar18 = uVar18 + 1;
    }
  }
  iVar12 = 2;
  if (2 < this->namrlevs) {
    iVar12 = this->namrlevs;
  }
  std::
  vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::resize(&(this->cor_hold).
            super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
           ,(ulong)(iVar12 - 1));
  iVar12 = *(this->linop->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
            (&((this->cor_hold).
               super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
               .
               super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<amrex::Any,_std::allocator<amrex::Any>_>,(long)iVar12);
  iVar17 = 1;
  if (1 < iVar12) {
    iVar17 = iVar12;
  }
  uVar19 = 0;
  for (lVar20 = 0; (ulong)(iVar17 - 1) << 3 != lVar20; lVar20 = lVar20 + 8) {
    if (this->solve_called == 0) {
      local_1b8._8_4_ = local_1f0;
      local_1b8._0_8_ = local_1f8;
      if (this->cf_strategy == ghostnodes) {
        local_1b8._8_4_ = (*this->linop->_vptr_MLLinOp[6])(this->linop,0,uVar19 & 0xffffffff);
        local_1b8._4_4_ = local_1b8._8_4_;
        local_1b8._0_4_ = local_1b8._8_4_;
      }
      (*this->linop->_vptr_MLLinOp[0x27])
                (&local_200,this->linop,0,uVar19 & 0xffffffff,
                 (_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)local_1b8);
      plVar7 = local_200;
      lVar21 = *(long *)&(((this->cor_hold).
                           super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                         super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>;
      local_200 = (long *)0x0;
      plVar5 = *(long **)(lVar21 + lVar20);
      *(long **)(lVar21 + lVar20) = plVar7;
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 0x10))();
      }
      if (local_200 != (long *)0x0) {
        (**(code **)(*local_200 + 0x10))();
      }
    }
    (*this->linop->_vptr_MLLinOp[0x2e])();
    uVar19 = uVar19 + 1;
  }
  lVar20 = 0x18;
  for (uVar19 = 1; (long)uVar19 < (long)this->finest_amr_lev; uVar19 = uVar19 + 1) {
    std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
              ((vector<amrex::Any,_std::allocator<amrex::Any>_> *)
               ((long)&(((this->cor_hold).
                         super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                       super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar20),1);
    if (this->solve_called == 0) {
      local_1b8._8_4_ = local_1f0;
      local_1b8._0_8_ = local_1f8;
      if (this->cf_strategy == ghostnodes) {
        local_1b8._8_4_ = (*this->linop->_vptr_MLLinOp[6])(this->linop,uVar19 & 0xffffffff,0);
        local_1b8._4_4_ = local_1b8._8_4_;
        local_1b8._0_4_ = local_1b8._8_4_;
      }
      (*this->linop->_vptr_MLLinOp[0x27])
                (&local_200,this->linop,uVar19 & 0xffffffff,0,
                 (_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)local_1b8);
      plVar8 = local_200;
      plVar5 = *(long **)((long)&(((this->cor_hold).
                                   super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                   .
                                   super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl
                                 .super__Vector_impl_data._M_start + lVar20);
      local_200 = (long *)0x0;
      plVar7 = (long *)*plVar5;
      *plVar5 = (long)plVar8;
      if (plVar7 != (long *)0x0) {
        (**(code **)(*plVar7 + 0x10))();
      }
      if (local_200 != (long *)0x0) {
        (**(code **)(*local_200 + 0x10))();
      }
    }
    (*this->linop->_vptr_MLLinOp[0x2e])
              (this->linop,
               *(undefined8 *)
                ((long)&(((this->cor_hold).
                          super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                        super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar20));
    lVar20 = lVar20 + 0x18;
  }
  if (this->linop->m_parent == (MLLinOp *)0x0) {
    iVar12 = (*this->linop->_vptr_MLLinOp[0x25])();
    if ((char)iVar12 != '\0') {
      if ((this->do_nsolve != 0) &&
         ((this->ns_linop)._M_t.
          super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>._M_t.
          super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>.
          super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl == (MLLinOp *)0x0)) {
        prepareForNSolve(this);
      }
      goto LAB_005d6de6;
    }
  }
  this->do_nsolve = 0;
LAB_005d6de6:
  if (1 < this->verbose) {
    poVar15 = OutStream();
    Print::Print((Print *)local_1b8,poVar15);
    std::operator<<((ostream *)(local_1b8 + 0x10),"MLMG: # of AMR levels: ");
    pPVar16 = Print::operator<<((Print *)local_1b8,local_1d0);
    this_02 = &pPVar16->ss;
    std::operator<<((ostream *)this_02,"\n");
    std::operator<<((ostream *)this_02,"      # of MG levels on the coarsest AMR level: ");
    std::ostream::operator<<
              (this_02,*(this->linop->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
    std::operator<<((ostream *)this_02,"\n");
    Print::~Print((Print *)local_1b8);
    if ((this->ns_linop)._M_t.
        super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>._M_t.
        super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>.
        super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl != (MLLinOp *)0x0) {
      poVar15 = OutStream();
      Print::Print((Print *)local_1b8,poVar15);
      this_01 = (_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)(local_1b8 + 0x10);
      std::operator<<((ostream *)this_01,"      # of MG levels in N-Solve: ");
      std::ostream::operator<<
                (this_01,**(int **)&(((this->ns_linop)._M_t.
                                      super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>
                                      .super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl)
                                    ->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
                                    super__Vector_base<int,_std::allocator<int>_>);
      std::operator<<((ostream *)this_01,"\n");
      std::operator<<((ostream *)this_01,"      # of grids in N-Solve: ");
      std::ostream::_M_insert<long>((long)this_01);
      std::operator<<((ostream *)this_01,"\n");
      Print::~Print((Print *)local_1b8);
    }
  }
  return;
}

Assistant:

void
MLMG::prepareForSolve (Vector<Any>& a_sol, const Vector<Any>& a_rhs)
{
    BL_PROFILE("MLMG::prepareForSolve()");

    AMREX_ASSERT(namrlevs <= a_sol.size());
    AMREX_ASSERT(namrlevs <= a_rhs.size());

    timer.assign(ntimers, 0.0);

    IntVect ng_rhs(0);
    IntVect ng_sol(1);
    if (linop.hasHiddenDimension()) ng_sol[linop.hiddenDirection()] = 0;

    if (!linop_prepared) {
        linop.prepareForSolve();
        linop_prepared = true;
    } else if (linop.needsUpdate()) {
        linop.update();

#if defined(AMREX_USE_HYPRE) && (AMREX_SPACEDIM > 1)
        hypre_solver.reset();
        hypre_bndry.reset();
        hypre_node_solver.reset();
#endif

#ifdef AMREX_USE_PETSC
        petsc_solver.reset();
        petsc_bndry.reset();
#endif
    }

    sol.resize(namrlevs);
    sol_is_alias.resize(namrlevs);
    for (int alev = 0; alev < namrlevs; ++alev)
    {
        if (cf_strategy == CFStrategy::ghostnodes)
        {
            sol[alev] = linop.AnyMakeAlias(a_sol[alev]);
            sol_is_alias[alev] = true;
        }
        else if (linop.AnyGrowVect(a_sol[alev]) == ng_sol)
        {
            sol[alev] = linop.AnyMakeAlias(a_sol[alev]);
            linop.AnySetBndryToZero(sol[alev]);
            sol_is_alias[alev] = true;
        }
        else
        {
            if (!solve_called) {
                sol[alev] = linop.AnyMake(alev, 0, ng_sol);
            }
            linop.AnyCopy(sol[alev], a_sol[alev], IntVect(0));
            linop.AnySetBndryToZero(sol[alev]);
            sol_is_alias[alev] = false;
        }
    }

    rhs.resize(namrlevs);
    for (int alev = 0; alev < namrlevs; ++alev)
    {
        if (cf_strategy == CFStrategy::ghostnodes) ng_rhs = IntVect(linop.getNGrow(alev));
        if (!solve_called) {
            rhs[alev] = linop.AnyMake(alev, 0, ng_rhs);
        }
        linop.AnyCopy(rhs[alev], a_rhs[alev], ng_rhs);
        linop.applyMetricTerm(alev, 0, rhs[alev]);
        linop.unimposeNeumannBC(alev, rhs[alev]);
        linop.applyInhomogNeumannTerm(alev, rhs[alev]);
        linop.applyOverset(alev, rhs[alev]);
        linop.scaleRHS(alev, rhs[alev]);

#ifdef AMREX_USE_EB
        auto factory = dynamic_cast<EBFArrayBoxFactory const*>(linop.Factory(alev));
        if (factory) {
            linop.AnySetCoveredToZero(rhs[alev]);
            linop.AnySetCoveredToZero(sol[alev]);
        }
#endif
    }

    for (int falev = finest_amr_lev; falev > 0; --falev)
    {
        linop.AnyAverageDownSolutionRHS(falev-1, sol[falev-1], rhs[falev-1],
                                        sol[falev], rhs[falev]);
    }

    // enforce solvability if appropriate
    if (linop.isSingular(0) && linop.getEnforceSingularSolvable())
    {
        makeSolvable();
    }

    IntVect ng = linop.isCellCentered() ? IntVect(0) : IntVect(1);
    if (cf_strategy == CFStrategy::ghostnodes) ng = ng_rhs;
    if (!solve_called) {
        linop.make(res, ng);
        linop.make(rescor, ng);
    }
    for (int alev = 0; alev <= finest_amr_lev; ++alev)
    {
        const int nmglevs = linop.NMGLevels(alev);
        for (int mglev = 0; mglev < nmglevs; ++mglev)
        {
            linop.AnySetToZero(res   [alev][mglev]);
            linop.AnySetToZero(rescor[alev][mglev]);
        }
    }

    if (cf_strategy != CFStrategy::ghostnodes) ng = ng_sol;
    cor.resize(namrlevs);
    for (int alev = 0; alev <= finest_amr_lev; ++alev)
    {
        const int nmglevs = linop.NMGLevels(alev);
        cor[alev].resize(nmglevs);
        for (int mglev = 0; mglev < nmglevs; ++mglev)
        {
            if (!solve_called) {
                IntVect _ng = ng;
                if (cf_strategy == CFStrategy::ghostnodes) _ng=IntVect(linop.getNGrow(alev,mglev));
                cor[alev][mglev] = linop.AnyMake(alev, mglev, _ng);
            }
            linop.AnySetToZero(cor[alev][mglev]);
        }
    }

    cor_hold.resize(std::max(namrlevs-1,1));
    {
        const int alev = 0;
        const int nmglevs = linop.NMGLevels(alev);
        cor_hold[alev].resize(nmglevs);
        for (int mglev = 0; mglev < nmglevs-1; ++mglev)
        {
            if (!solve_called) {
                IntVect _ng = ng;
                if (cf_strategy == CFStrategy::ghostnodes) _ng=IntVect(linop.getNGrow(alev,mglev));
                cor_hold[alev][mglev] = linop.AnyMake(alev, mglev, _ng);
            }
            linop.AnySetToZero(cor_hold[alev][mglev]);
        }
    }
    for (int alev = 1; alev < finest_amr_lev; ++alev)
    {
        cor_hold[alev].resize(1);
        if (!solve_called) {
            IntVect _ng = ng;
            if (cf_strategy == CFStrategy::ghostnodes) _ng=IntVect(linop.getNGrow(alev));
            cor_hold[alev][0] = linop.AnyMake(alev, 0, _ng);
        }
        linop.AnySetToZero(cor_hold[alev][0]);
    }

    if (linop.m_parent) {
        do_nsolve = false;  // no embedded N-Solve
    } else if (!linop.supportNSolve()) {
        do_nsolve = false;
    }

    if (do_nsolve && ns_linop == nullptr)
    {
        prepareForNSolve();
    }

    if (verbose >= 2) {
        amrex::Print() << "MLMG: # of AMR levels: " << namrlevs << "\n"
                       << "      # of MG levels on the coarsest AMR level: " << linop.NMGLevels(0)
                       << "\n";
        if (ns_linop) {
            amrex::Print() << "      # of MG levels in N-Solve: " << ns_linop->NMGLevels(0) << "\n"
                           << "      # of grids in N-Solve: " << ns_linop->m_grids[0][0].size() << "\n";
        }
    }
}